

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIS_Logger_Playback.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DIS_Logger_Playback::DIS_Logger_Playback
          (DIS_Logger_Playback *this,KString *FileName,KUINT16 BufferSz)

{
  _Ios_Openmode _Var1;
  KUINT16 BufferSz_local;
  KString *FileName_local;
  DIS_Logger_Playback *this_local;
  
  std::fstream::fstream(this);
  this->m_ui16PreLoadLines = BufferSz;
  std::
  queue<KDIS::UTILS::DIS_Logger_Playback::Log,std::deque<KDIS::UTILS::DIS_Logger_Playback::Log,std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>>>
  ::
  queue<std::deque<KDIS::UTILS::DIS_Logger_Playback::Log,std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>>,void>
            ((queue<KDIS::UTILS::DIS_Logger_Playback::Log,std::deque<KDIS::UTILS::DIS_Logger_Playback::Log,std::allocator<KDIS::UTILS::DIS_Logger_Playback::Log>>>
              *)&this->m_qLog);
  _Var1 = std::__cxx11::string::c_str();
  std::fstream::open((char *)this,_Var1);
  return;
}

Assistant:

DIS_Logger_Playback::DIS_Logger_Playback(  const KString & FileName, KUINT16 BufferSz  ) :
    m_ui16PreLoadLines( BufferSz )
{
    m_File.open( FileName.c_str(), ios::in );
}